

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O3

int __thiscall Counter64::serialise(Counter64 *this,uint8_t *buf,size_t max_len)

{
  int iVar1;
  
  iVar1 = -0x1f;
  if (1 < max_len) {
    *buf = (char)(this->super_BER_CONTAINER)._type;
    buf[1] = '\b';
    if (9 < max_len) {
      buf[2] = *(uint8_t *)((long)&this->_value + 7);
      buf[3] = *(uint8_t *)((long)&this->_value + 6);
      buf[4] = *(uint8_t *)((long)&this->_value + 5);
      buf[5] = *(uint8_t *)((long)&this->_value + 4);
      buf[6] = *(uint8_t *)((long)&this->_value + 3);
      buf[7] = *(uint8_t *)((long)&this->_value + 2);
      buf[8] = *(uint8_t *)((long)&this->_value + 1);
      buf[9] = (uint8_t)this->_value;
      iVar1 = 10;
    }
  }
  return iVar1;
}

Assistant:

int Counter64::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, 8);
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;

    *ptr++ = _value >> 56 & 0xFF;
    *ptr++ = _value >> 48 & 0xFF;
    *ptr++ = _value >> 40 & 0xFF;
    *ptr++ = _value >> 32 & 0xFF;
    *ptr++ = _value >> 24 & 0xFF;
    *ptr++ = _value >> 16 & 0xFF;
    *ptr++ = _value >> 8 & 0xFF;
    *ptr++ = _value & 0xFF;
    
    return ptr - buf;
}